

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O0

void test_2d_dynamic<0ul,5ul,1ul,30ul>(void)

{
  int *piVar1;
  int *piVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  bool bVar10;
  int local_1fc [3];
  dynamic_dims_array local_1f0;
  int local_1e0 [2];
  dynamic_dims_array local_1d8;
  size_type local_1c8;
  dynamic_dims_array local_1c0;
  unsigned_long local_1b0;
  value_type true_idx_1;
  int local_194;
  undefined1 auStack_190 [4];
  int i_1;
  int local_17c;
  int local_178;
  int j_1;
  dynamic_dims_array local_170;
  int local_160 [2];
  dynamic_dims_array local_158;
  size_type local_148;
  dynamic_dims_array local_140;
  unsigned_long local_130;
  value_type true_idx;
  int local_114;
  undefined1 auStack_110 [4];
  int i;
  int local_fc;
  int *piStack_f8;
  int j;
  int *dptr;
  allocator<int> local_dd;
  value_type_conflict1 local_dc;
  dynamic_dims_array local_d8;
  dynamic_dims_array local_c8;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_98;
  unsigned_long local_90;
  size_type local_88;
  int local_7c;
  size_type local_78;
  int local_6c;
  size_type local_68;
  bool local_5a;
  bool local_59;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_58;
  dimensions<1UL,_1UL> local_41;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_40;
  undefined1 local_30 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_40,1,0x1e);
  std::experimental::dimensions<1UL,_1UL>::dimensions(&local_41);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_58,0,5);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              *)local_30,local_40.dynamic_dims_._M_elems[0],local_40.dynamic_dims_._M_elems[1],
             local_58.dynamic_dims_._M_elems[0],local_58.dynamic_dims_._M_elems[1]);
  local_59 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::is_regular();
  local_5a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x76,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_59,
             &local_5a);
  local_68 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                       *)local_30,0);
  local_6c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x78,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_68,
             &local_6c);
  local_78 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                       *)local_30,1);
  local_7c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x79,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_78,
             &local_7c);
  local_88 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30);
  local_90 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7b,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_88,
             &local_90);
  local_98 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                     *)local_30);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x23;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x7c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_98,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,0);
  local_c8._M_elems =
       (_Type)std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         *)local_30);
  vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_c8,0)
  ;
  vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,1);
  local_d8._M_elems =
       (_Type)std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
              ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         *)local_30);
  vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&local_d8,1)
  ;
  local_dc = 0x2a;
  std::allocator<int>::allocator(&local_dd);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b8,(vVar3 + vVar4) * (vVar5 + vVar6),
             &local_dc,&local_dd);
  std::allocator<int>::~allocator(&local_dd);
  piStack_f8 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_b8);
  local_fc = 0;
  while( true ) {
    uVar7 = (ulong)local_fc;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,1
                           );
    _auStack_110 = (_Type)std::experimental::
                          layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                          ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                     *)local_30);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_110,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_114 = 0;
    while( true ) {
      uVar7 = (ulong)local_114;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,0);
      _true_idx = (_Type)std::experimental::
                         layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                         ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                    *)local_30);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      if (vVar3 + vVar4 <= uVar7) break;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,1);
      local_140._M_elems =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                  ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                             *)local_30);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_140,1);
      local_130 = (vVar3 + vVar4) * (long)local_114 + (long)local_fc;
      local_148 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_114,local_fc);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x8a,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_148,
                 &local_130);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,0);
      bVar10 = false;
      if (vVar3 <= (ulong)(long)local_114) {
        uVar7 = (ulong)local_114;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_30,0);
        local_158._M_elems =
             (_Type)std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                    ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                               *)local_30);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_158,0);
        bVar10 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_f8;
      if (bVar10) {
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_30,local_114,local_fc);
        piVar2 = piStack_f8;
        piVar1[sVar8] = 0x11;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_30,local_114,local_fc);
        local_160[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x91,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                   piVar2 + sVar8,local_160 + 1);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_30,local_114,local_fc);
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_b8,sVar8);
        local_160[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x94,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar9,
                   local_160);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_30,1);
        bVar10 = false;
        if (vVar3 <= (ulong)(long)local_fc) {
          uVar7 = (ulong)local_fc;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_30,1);
          local_170._M_elems =
               (_Type)std::experimental::
                      layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                 *)local_30);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_170,1);
          bVar10 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_f8;
        if (bVar10) {
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_114,local_fc);
          piVar2 = piStack_f8;
          piVar1[sVar8] = 0x18;
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_114,local_fc);
          j_1 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x9c,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                     piVar2 + sVar8,&j_1);
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_114,local_fc);
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)local_b8,sVar8);
          local_178 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x9f,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar9,
                     &local_178);
        }
      }
      local_114 = local_114 + 1;
    }
    local_fc = local_fc + 1;
  }
  local_17c = 0;
  while( true ) {
    uVar7 = (ulong)local_17c;
    vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,1
                           );
    _auStack_190 = (_Type)std::experimental::
                          layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                          ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                     *)local_30);
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                            auStack_190,1);
    if (vVar3 + vVar4 <= uVar7) break;
    local_194 = 0;
    while( true ) {
      uVar7 = (ulong)local_194;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,0);
      _true_idx_1 = (_Type)std::experimental::
                           layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                           ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                      *)local_30);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx_1,0);
      if (vVar3 + vVar4 <= uVar7) break;
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,1);
      local_1c0._M_elems =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                  ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                             *)local_30);
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_1c0,1);
      local_1b0 = (vVar3 + vVar4) * (long)local_194 + (long)local_17c;
      local_1c8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_194,local_17c);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0xa9,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",&local_1c8,
                 &local_1b0);
      vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,0);
      bVar10 = false;
      if (vVar3 <= (ulong)(long)local_194) {
        uVar7 = (ulong)local_194;
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_30,0);
        local_1d8._M_elems =
             (_Type)std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                    ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                               *)local_30);
        vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_1d8,0);
        bVar10 = uVar7 < vVar3 + vVar4;
      }
      piVar1 = piStack_f8;
      if (bVar10) {
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_30,local_194,local_17c);
        local_1e0[1] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0xae,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                   piVar1 + sVar8,local_1e0 + 1);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                  *)local_30,local_194,local_17c);
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_b8,sVar8);
        local_1e0[0] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0xb1,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar9,
                   local_1e0);
      }
      else {
        vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                local_30,1);
        bVar10 = false;
        if (vVar3 <= (ulong)(long)local_17c) {
          uVar7 = (ulong)local_17c;
          vVar3 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  local_30,1);
          local_1f0._M_elems =
               (_Type)std::experimental::
                      layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                      ::padding((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>_>
                                 *)local_30);
          vVar4 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                  operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                  &local_1f0,1);
          bVar10 = uVar7 < vVar3 + vVar4;
        }
        piVar1 = piStack_f8;
        if (bVar10) {
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_194,local_17c);
          local_1fc[2] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xb7,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                     piVar1 + sVar8,local_1fc + 2);
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_194,local_17c);
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)local_b8,sVar8);
          local_1fc[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xba,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",pvVar9,
                     local_1fc + 1);
        }
        else {
          sVar8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>>
                                    *)local_30,local_194,local_17c);
          local_1fc[0] = 0x2a;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0xc0,"void test_2d_dynamic() [N = 0UL, M = 5UL, X = 1UL, Y = 30UL]",
                     piVar1 + sVar8,local_1fc);
        }
      }
      local_194 = local_194 + 1;
    }
    local_17c = local_17c + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<dyn, dyn>
    > const l{{X, Y}, {}, {N, M}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.padding()[0]) * (l[1] + l.padding()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}